

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

bool Js::IntlEngineInterfaceExtensionObject::InitializeIntlNativeInterfaces
               (DynamicObject *intlNativeInterfaces,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  JavascriptSymbol *value;
  DynamicObject *pDVar1;
  
  DeferredTypeHandlerBase::Convert(typeHandler,intlNativeInterfaces,mode,0x23,0);
  this = (((((((intlNativeInterfaces->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
         javascriptLibrary;
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1ec,(FunctionInfo *)EntryInfo::Intl_RaiseAssert,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1ed,(FunctionInfo *)EntryInfo::Intl_IsWellFormedLanguageTag
             ,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1ee,(FunctionInfo *)EntryInfo::Intl_NormalizeLanguageTag,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1ef,(FunctionInfo *)EntryInfo::Intl_IsDTFLocaleAvailable,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1f0,
             (FunctionInfo *)EntryInfo::Intl_IsCollatorLocaleAvailable,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1f1,(FunctionInfo *)EntryInfo::Intl_IsNFLocaleAvailable,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1f2,(FunctionInfo *)EntryInfo::Intl_IsPRLocaleAvailable,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,499,(FunctionInfo *)EntryInfo::Intl_ResolveLocaleLookup,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,500,(FunctionInfo *)EntryInfo::Intl_ResolveLocaleBestFit,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1f5,(FunctionInfo *)EntryInfo::Intl_GetDefaultLocale,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1f6,(FunctionInfo *)EntryInfo::Intl_GetExtensions,1,'\x06')
  ;
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1f7,(FunctionInfo *)EntryInfo::Intl_CompareString,1,'\x06')
  ;
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1f8,(FunctionInfo *)EntryInfo::Intl_FormatNumber,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1f9,(FunctionInfo *)EntryInfo::Intl_CacheNumberFormat,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1fa,(FunctionInfo *)EntryInfo::Intl_CreateDateTimeFormat,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1fb,(FunctionInfo *)EntryInfo::Intl_CurrencyDigits,1,'\x06'
            );
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1fc,(FunctionInfo *)EntryInfo::Intl_FormatDateTime,1,'\x06'
            );
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1fd,
             (FunctionInfo *)EntryInfo::Intl_ValidateAndCanonicalizeTimeZone,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1fe,(FunctionInfo *)EntryInfo::Intl_GetDefaultTimeZone,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x1ff,(FunctionInfo *)EntryInfo::Intl_GetPatternForSkeleton,1
             ,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x200,(FunctionInfo *)EntryInfo::Intl_GetLocaleData,1,'\x06')
  ;
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x201,(FunctionInfo *)EntryInfo::Intl_LocaleCompare,1,'\x06')
  ;
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x202,(FunctionInfo *)EntryInfo::Intl_PluralRulesSelect,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x203,(FunctionInfo *)EntryInfo::Intl_PluralRulesKeywords,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x204,(FunctionInfo *)EntryInfo::Intl_RegisterBuiltInFunction
             ,1,'\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x205,(FunctionInfo *)EntryInfo::Intl_GetHiddenObject,1,
             '\x06');
  JavascriptLibrary::AddFunctionToLibraryObject
            (this,intlNativeInterfaces,0x206,(FunctionInfo *)EntryInfo::Intl_SetHiddenObject,1,
             '\x06');
  value = JavascriptLibrary::CreateSymbol
                    (this,(PropertyRecord *)BuiltInPropertyRecords::_intlFallbackSymbol);
  JavascriptLibrary::AddMember(this,intlNativeInterfaces,0x230,value);
  pDVar1 = JavascriptLibrary::CreateObject(this,false,0);
  JavascriptLibrary::AddMember(this,pDVar1,0x216,&DAT_1000000000000);
  JavascriptLibrary::AddMember(this,pDVar1,0x218,&DAT_1000000000001);
  JavascriptLibrary::AddMember(this,pDVar1,0x217,&DAT_1000000000002);
  JavascriptLibrary::AddMember(this,pDVar1,0x21a,&DAT_1000000000003);
  JavascriptLibrary::AddMember(this,pDVar1,0x219,&DAT_1000000000004);
  JavascriptLibrary::AddMember(this,pDVar1,0x21b,&DAT_1000000000005);
  JavascriptLibrary::AddMember(this,intlNativeInterfaces,0x229,pDVar1);
  pDVar1 = JavascriptLibrary::CreateObject(this,false,0);
  JavascriptLibrary::AddMember(this,pDVar1,0x6e,&DAT_1000000000002);
  JavascriptLibrary::AddMember(this,pDVar1,0x21c,&DAT_1000000000000);
  JavascriptLibrary::AddMember(this,pDVar1,0x21d,&DAT_1000000000001);
  JavascriptLibrary::AddMember(this,pDVar1,0x84,&DAT_1000000000002);
  JavascriptLibrary::AddMember(this,intlNativeInterfaces,0x228,pDVar1);
  pDVar1 = JavascriptLibrary::CreateObject(this,false,0);
  JavascriptLibrary::AddMember(this,pDVar1,0x6e,&DAT_1000000000003);
  JavascriptLibrary::AddMember(this,pDVar1,0x21e,&DAT_1000000000000);
  JavascriptLibrary::AddMember(this,pDVar1,0x21f,&DAT_1000000000001);
  JavascriptLibrary::AddMember(this,pDVar1,0x220,&DAT_1000000000002);
  JavascriptLibrary::AddMember(this,pDVar1,0x221,&DAT_1000000000003);
  JavascriptLibrary::AddMember(this,intlNativeInterfaces,0x227,pDVar1);
  pDVar1 = JavascriptLibrary::CreateObject(this,false,0);
  JavascriptLibrary::AddMember(this,pDVar1,0x6e,&DAT_1000000000000);
  JavascriptLibrary::AddMember(this,pDVar1,0x165,&DAT_1000000000000);
  JavascriptLibrary::AddMember(this,pDVar1,0x222,&DAT_1000000000001);
  JavascriptLibrary::AddMember(this,pDVar1,0x106,&DAT_1000000000002);
  JavascriptLibrary::AddMember(this,intlNativeInterfaces,0x226,pDVar1);
  pDVar1 = JavascriptLibrary::CreateObject(this,false,0);
  JavascriptLibrary::AddMember(this,pDVar1,0x6e,&DAT_1000000000000);
  JavascriptLibrary::AddMember(this,pDVar1,0x223,&DAT_1000000000000);
  JavascriptLibrary::AddMember(this,pDVar1,0x224,&DAT_1000000000001);
  JavascriptLibrary::AddMember(this,pDVar1,0x240,&DAT_1000000000002);
  JavascriptLibrary::AddMember(this,intlNativeInterfaces,0x225,pDVar1);
  pDVar1 = JavascriptLibrary::CreateObject(this,false,0);
  JavascriptLibrary::AddMember(this,pDVar1,0x22a,&DAT_1000000000000);
  JavascriptLibrary::AddMember(this,pDVar1,0x22b,&DAT_1000000000001);
  JavascriptLibrary::AddMember(this,pDVar1,0x22c,&DAT_1000000000002);
  JavascriptLibrary::AddMember(this,pDVar1,0x22d,&DAT_1000000000003);
  JavascriptLibrary::AddMember(this,pDVar1,0x22e,&DAT_1000000000004);
  JavascriptLibrary::AddMember(this,intlNativeInterfaces,0x22f,pDVar1);
  JavascriptLibrary::AddMember
            (this,intlNativeInterfaces,0x213,(this->super_JavascriptLibraryBase).booleanFalse.ptr);
  JavascriptLibrary::AddMember
            (this,intlNativeInterfaces,0xbb,(this->super_JavascriptLibraryBase).IntlObject.ptr);
  DynamicObject::SetHasNoEnumerableProperties(intlNativeInterfaces,true);
  return true;
}

Assistant:

bool IntlEngineInterfaceExtensionObject::InitializeIntlNativeInterfaces(DynamicObject* intlNativeInterfaces, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        int initSlotCapacity = 0;

        // automatically get the initSlotCapacity from everything we are about to add to intlNativeInterfaces
#define INTL_ENTRY(id, func) initSlotCapacity++;
#include "IntlExtensionObjectBuiltIns.h"
#undef INTL_ENTRY

#define PROJECTED_ENUM(ClassName, VALUES) initSlotCapacity++;
PROJECTED_ENUMS(PROJECTED_ENUM)
#undef PROJECTED_ENUM

        // add capacity for platform.winglob and platform.FallbackSymbol
        initSlotCapacity += 2;

        typeHandler->Convert(intlNativeInterfaces, mode, initSlotCapacity);

        ScriptContext* scriptContext = intlNativeInterfaces->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

// gives each entrypoint a property ID on the intlNativeInterfaces library object
#define INTL_ENTRY(id, func) library->AddFunctionToLibraryObject(intlNativeInterfaces, Js::PropertyIds::##id, &IntlEngineInterfaceExtensionObject::EntryInfo::Intl_##func, 1);
#include "IntlExtensionObjectBuiltIns.h"
#undef INTL_ENTRY

        library->AddMember(intlNativeInterfaces, PropertyIds::FallbackSymbol, library->CreateSymbol(BuiltInPropertyRecords::_intlFallbackSymbol));

        DynamicObject * enumObj = nullptr;

// Projects the exact layout of our C++ enums into Intl.js so that we dont have to remember to keep them in sync
#define ENUM_VALUE(enumName, propId, value) library->AddMember(enumObj, PropertyIds::##propId, JavascriptNumber::ToVar(value, scriptContext));
#define PROJECTED_ENUM(ClassName, VALUES) \
    enumObj = library->CreateObject(); \
    VALUES(ENUM_VALUE) \
    library->AddMember(intlNativeInterfaces, PropertyIds::##ClassName, enumObj); \

PROJECTED_ENUMS(PROJECTED_ENUM)

#undef PROJECTED_ENUM
#undef ENUM_VALUE

#if INTL_WINGLOB
        library->AddMember(intlNativeInterfaces, Js::PropertyIds::winglob, library->GetTrue());
#else
        library->AddMember(intlNativeInterfaces, Js::PropertyIds::winglob, library->GetFalse());

#if defined(NTBUILD)
        // when using ICU, we can call ulocdata_getCLDRVersion to ensure that ICU is functioning properly before allowing Intl to continue.
        // ulocdata_getCLDRVersion will cause the data file to be loaded, and if we don't have enough memory to do so, we can throw OutOfMemory here.
        // This is to protect against spurious U_MISSING_RESOURCE_ERRORs and U_FILE_ACCESS_ERRORs coming from early-lifecycle
        // functions that require ICU data.
        // See OS#16897150, OS#16896933, and others relating to bad statuses returned by GetLocaleData and IsLocaleAvailable
        // This was initially attempted using u_init, however u_init does not work with Node's default small-icu data file
        // because it contains no converters.
        UErrorCode status = U_ZERO_ERROR;
        UVersionInfo cldrVersion;
        ulocdata_getCLDRVersion(cldrVersion, &status);
        if (status == U_MEMORY_ALLOCATION_ERROR || status == U_FILE_ACCESS_ERROR || status == U_MISSING_RESOURCE_ERROR)
        {
            // Trace that this happens in case there are build system changes that actually cause the data file to be not found
            INTL_TRACE("Could not initialize ICU - ulocdata_getCLDRVersion returned status %S", u_errorName(status));
            Throw::OutOfMemory();
        }
        else
        {
            INTL_TRACE("Using CLDR version %d.%d.%d.%d", cldrVersion[0], cldrVersion[1], cldrVersion[2], cldrVersion[3]);
        }

        AssertOrFailFastMsg(U_SUCCESS(status), "ulocdata_getCLDRVersion returned non-OOM failure");
#endif // defined(NTBUILD)
#endif // else !INTL_WINGLOB

        // Add a reference to the built-in Intl object that can be referenced from the init code in Intl.js.
        library->AddMember(intlNativeInterfaces, Js::PropertyIds::Intl, library->GetIntlObject());

        intlNativeInterfaces->SetHasNoEnumerableProperties(true);

        return true;
    }